

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadBodyInertia::SetInertiaXY(ChLoadBodyInertia *this,ChVector<double> *iner)

{
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       iner->m_data[0];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       iner->m_data[1];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       iner->m_data[2];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       iner->m_data[0];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       iner->m_data[1];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       iner->m_data[2];
  return;
}

Assistant:

void ChLoadBodyInertia::SetInertiaXY(const ChVector<>& iner) {
    I(0, 1) = iner.x();
    I(0, 2) = iner.y();
    I(1, 2) = iner.z();
    I(1, 0) = iner.x();
    I(2, 0) = iner.y();
    I(2, 1) = iner.z();
}